

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewWidget.cpp
# Opt level: O2

void __thiscall KDReports::PreviewWidgetPrivate::setupComboBoxes(PreviewWidgetPrivate *this)

{
  QComboBox *pQVar1;
  QArrayDataPointer<char16_t> local_70;
  QVariant local_58;
  QArrayDataPointer<char16_t> local_38;
  
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A0 (841 x 1189 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,3);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A1 (594 x 841 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,4);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A2 (420 x 594 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,5);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A3 (297 x 420 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,6);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A4 (210 x 297 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,7);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A5 (148 x 210 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,8);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A6 (105 x 148 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,9);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A7 (74 x 105 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,10);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"A8 (52 x 74 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0xb);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B0 (1000 x 1414 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0xe);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B1 (707 x 1000 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0xf);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B2 (500 x 707 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x10);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B3 (353 x 500 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x11);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B4 (250 x 353 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x12);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B5 (176 x 250 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x13);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B6 (125 x 176 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x14);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B7 (88 x 125 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x15);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"B8 (62 x 88 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x16);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"C5E (163 x 229 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x19);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"DLE (110 x 220 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x1b);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"Executive (7.5 x 10 inches)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,2);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"Folio (210 x 330 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x1c);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"Ledger (432 x 279 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x1d);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"Legal (8.5 x 14 inches)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,1);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"Letter (8.5 x 11 inches)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"Tabloid (279 x 432 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x1e);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_70,"US #10 Envelope (105 x 241 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0x1a);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr((QString *)&local_38,"Endless printer (%1 mm wide)",(char *)0x0,-1);
  QString::arg(this->m_endlessPrinterWidth,(int)&local_70,(char)&local_38,0,(QChar)0x67);
  QVariant::QVariant(&local_58,0x1f);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperOrientationCombo;
  PreviewWidget::tr((QString *)&local_70,"Portrait",(char *)0x0,-1);
  QVariant::QVariant(&local_58,0);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperOrientationCombo;
  PreviewWidget::tr((QString *)&local_70,"Landscape",(char *)0x0,-1);
  QVariant::QVariant(&local_58,1);
  QComboBox::addItem(pQVar1,(QString *)&local_70,&local_58);
  QVariant::~QVariant(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  return;
}

Assistant:

void KDReports::PreviewWidgetPrivate::setupComboBoxes()
{
    paperSizeCombo->addItem(PreviewWidget::tr("A0 (841 x 1189 mm)"), QPageSize::A0);
    paperSizeCombo->addItem(PreviewWidget::tr("A1 (594 x 841 mm)"), QPageSize::A1);
    paperSizeCombo->addItem(PreviewWidget::tr("A2 (420 x 594 mm)"), QPageSize::A2);
    paperSizeCombo->addItem(PreviewWidget::tr("A3 (297 x 420 mm)"), QPageSize::A3);
    paperSizeCombo->addItem(PreviewWidget::tr("A4 (210 x 297 mm)"), QPageSize::A4);
    paperSizeCombo->addItem(PreviewWidget::tr("A5 (148 x 210 mm)"), QPageSize::A5);
    paperSizeCombo->addItem(PreviewWidget::tr("A6 (105 x 148 mm)"), QPageSize::A6);
    paperSizeCombo->addItem(PreviewWidget::tr("A7 (74 x 105 mm)"), QPageSize::A7);
    paperSizeCombo->addItem(PreviewWidget::tr("A8 (52 x 74 mm)"), QPageSize::A8);
    // paperSizeCombo->addItem(PreviewWidget::tr("A9 (37 x 52 mm)"), QPageSize::A9);
    paperSizeCombo->addItem(PreviewWidget::tr("B0 (1000 x 1414 mm)"), QPageSize::B0);
    paperSizeCombo->addItem(PreviewWidget::tr("B1 (707 x 1000 mm)"), QPageSize::B1);
    paperSizeCombo->addItem(PreviewWidget::tr("B2 (500 x 707 mm)"), QPageSize::B2);
    paperSizeCombo->addItem(PreviewWidget::tr("B3 (353 x 500 mm)"), QPageSize::B3);
    paperSizeCombo->addItem(PreviewWidget::tr("B4 (250 x 353 mm)"), QPageSize::B4);
    paperSizeCombo->addItem(PreviewWidget::tr("B5 (176 x 250 mm)"), QPageSize::B5);
    paperSizeCombo->addItem(PreviewWidget::tr("B6 (125 x 176 mm)"), QPageSize::B6);
    paperSizeCombo->addItem(PreviewWidget::tr("B7 (88 x 125 mm)"), QPageSize::B7);
    paperSizeCombo->addItem(PreviewWidget::tr("B8 (62 x 88 mm)"), QPageSize::B8);
    // paperSizeCombo->addItem(PreviewWidget::tr("B9 (44 x 62 mm)"), QPageSize::B9);
    // paperSizeCombo->addItem(PreviewWidget::tr("B10 (31 x 44 mm)"), QPageSize::B10);
    paperSizeCombo->addItem(PreviewWidget::tr("C5E (163 x 229 mm)"), QPageSize::C5E);
    paperSizeCombo->addItem(PreviewWidget::tr("DLE (110 x 220 mm)"), QPageSize::DLE);
    paperSizeCombo->addItem(PreviewWidget::tr("Executive (7.5 x 10 inches)"), QPageSize::Executive);
    paperSizeCombo->addItem(PreviewWidget::tr("Folio (210 x 330 mm)"), QPageSize::Folio);
    paperSizeCombo->addItem(PreviewWidget::tr("Ledger (432 x 279 mm)"), QPageSize::Ledger);
    paperSizeCombo->addItem(PreviewWidget::tr("Legal (8.5 x 14 inches)"), QPageSize::Legal);
    paperSizeCombo->addItem(PreviewWidget::tr("Letter (8.5 x 11 inches)"), QPageSize::Letter);
    paperSizeCombo->addItem(PreviewWidget::tr("Tabloid (279 x 432 mm)"), QPageSize::Tabloid);
    paperSizeCombo->addItem(PreviewWidget::tr("US #10 Envelope (105 x 241 mm)"), QPageSize::Comm10E);
    paperSizeCombo->addItem(PreviewWidget::tr("Endless printer (%1 mm wide)").arg(m_endlessPrinterWidth), QPageSize::Custom);

    paperOrientationCombo->addItem(PreviewWidget::tr("Portrait"), QPageLayout::Portrait);
    paperOrientationCombo->addItem(PreviewWidget::tr("Landscape"), QPageLayout::Landscape);
}